

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

Regexp * re2::Regexp::Parse(StringPiece *s,ParseFlags global_flags,RegexpStatus *status)

{
  undefined4 uVar1;
  ParseFlags parse_flags;
  undefined8 uVar2;
  int iVar3;
  ParseStatus PVar4;
  int iVar5;
  uint uVar6;
  string *utf;
  Regexp *pRVar7;
  CharClassBuilder *pCVar8;
  UGroup *g;
  Regexp *pRVar9;
  int iVar10;
  RegexpStatus *pRVar11;
  byte bVar12;
  uint8 uVar13;
  Regexp *pRVar14;
  RegexpOp op;
  bool bVar15;
  Rune r;
  int hi;
  int lo;
  ParseState ps;
  RegexpStatus xstatus;
  StringPiece local_c8;
  StringPiece local_b8;
  int local_a8;
  int local_a4;
  RegexpStatus *local_a0;
  ParseState local_98;
  StringPiece local_68;
  RegexpStatus local_50;
  
  pRVar11 = status;
  if (status == (RegexpStatus *)0x0) {
    pRVar11 = &local_50;
  }
  bVar15 = (global_flags & Latin1) == NoParseFlags;
  local_98.rune_max_ = 0xff;
  if (bVar15) {
    local_98.rune_max_ = 0x10ffff;
  }
  local_50.code_ = kRegexpSuccess;
  local_50.error_arg_.ptr_ = (char *)0x0;
  local_50.error_arg_.length_ = 0;
  local_50.tmp_ = (string *)0x0;
  local_98.whole_regexp_.ptr_ = s->ptr_;
  local_98.whole_regexp_.length_ = s->length_;
  local_98.whole_regexp_._12_4_ = *(undefined4 *)&s->field_0xc;
  local_98.stacktop_ = (Regexp *)0x0;
  local_98.ncap_ = 0;
  local_c8.ptr_ = s->ptr_;
  local_c8._8_8_ = *(undefined8 *)&s->length_;
  local_98.flags_ = global_flags;
  local_98.status_ = pRVar11;
  if (!bVar15) {
    utf = (string *)operator_new(0x20);
    (utf->_M_dataplus)._M_p = (pointer)&utf->field_2;
    utf->_M_string_length = 0;
    (utf->field_2)._M_local_buf[0] = '\0';
    ConvertLatin1ToUTF8(&local_c8,utf);
    RegexpStatus::set_tmp(pRVar11,utf);
    local_c8.ptr_ = (utf->_M_dataplus)._M_p;
    local_c8.length_ = (int)utf->_M_string_length;
  }
  if ((global_flags & Literal) != NoParseFlags) {
    if (0 < local_c8.length_) {
      do {
        iVar5 = StringPieceToRune((Rune *)&local_b8,&local_c8,pRVar11);
        if (iVar5 < 0) goto LAB_00125312;
        ParseState::PushLiteral(&local_98,(Rune)local_b8.ptr_);
      } while (0 < local_c8.length_);
    }
    pRVar9 = ParseState::DoFinish(&local_98);
    goto LAB_00125314;
  }
  local_a0 = status;
  if (local_c8.length_ < 1) {
LAB_001252e3:
    pRVar9 = ParseState::DoFinish(&local_98);
    goto LAB_00125314;
  }
  iVar5 = 0;
  pRVar7 = (Regexp *)0x0;
  uVar6 = local_c8.length_;
LAB_00124c8d:
  parse_flags = local_98.flags_;
  pRVar9 = (Regexp *)local_c8.ptr_;
  bVar12 = *(uint8 *)local_c8.ptr_;
  uVar1 = local_c8._12_4_;
  if (bVar12 < 0x3f) {
    switch(bVar12) {
    case 0x24:
      ParseState::PushDollar(&local_98);
      goto LAB_0012500a;
    default:
switchD_00124cb3_caseD_25:
      iVar5 = StringPieceToRune((Rune *)&local_b8,&local_c8,pRVar11);
      if (iVar5 < 0) goto LAB_00125312;
      ParseState::PushLiteral(&local_98,(Rune)local_b8.ptr_);
      goto LAB_00125148;
    case 0x28:
      if ((uVar6 == 1 || (local_98.flags_ >> 9 & 1) == 0) ||
         (*(uint8 *)((long)local_c8.ptr_ + 1) != '?')) {
        if ((local_98.flags_ >> 0xc & 1) == 0) {
          local_b8.ptr_ = (char *)0x0;
          local_b8._8_8_ = local_b8._8_8_ & 0xffffffff00000000;
          ParseState::DoLeftParen(&local_98,&local_b8);
        }
        else {
          ParseState::DoLeftParenNoCapture(&local_98);
        }
        goto LAB_0012500a;
      }
      bVar15 = ParseState::ParsePerlFlags(&local_98,&local_c8);
      pRVar9 = (Regexp *)0x0;
      iVar5 = 0;
      if (!bVar15) goto LAB_00125314;
      break;
    case 0x29:
      bVar15 = ParseState::DoRightParen(&local_98);
      if (bVar15) goto LAB_0012500a;
      goto LAB_00125312;
    case 0x2a:
      op = kRegexpStar;
      goto LAB_00124e23;
    case 0x2b:
      op = kRegexpPlus;
LAB_00124e23:
      local_b8.ptr_ = local_c8.ptr_;
      local_b8.length_ = local_c8.length_;
      local_b8._12_4_ = local_c8._12_4_;
      pRVar14 = (Regexp *)((long)local_c8.ptr_ + 1);
      local_c8.length_ = uVar6 - 1;
      local_c8._8_8_ = CONCAT44(uVar1,local_c8.length_);
      if ((local_98.flags_ & PerlX) == NoParseFlags) {
        bVar15 = false;
        local_c8.ptr_ = (char *)pRVar14;
      }
      else {
        if ((uVar6 - 1 == 0) || (*(uint8 *)pRVar14 != '?')) {
          bVar15 = false;
        }
        else {
          pRVar14 = (Regexp *)((long)local_c8.ptr_ + 2);
          local_c8.length_ = uVar6 - 2;
          local_c8._8_8_ = CONCAT44(uVar1,local_c8.length_);
          bVar15 = true;
        }
        local_c8.ptr_ = (char *)pRVar14;
        if (0 < iVar5) {
          pRVar11->code_ = kRegexpRepeatOp;
          pRVar11 = &local_50;
          if (local_a0 != (RegexpStatus *)0x0) {
            pRVar11 = local_a0;
          }
          (pRVar11->error_arg_).ptr_ = (char *)pRVar7;
          (pRVar11->error_arg_).length_ = (int)pRVar14 - (int)pRVar7;
          goto LAB_00125312;
        }
      }
      iVar5 = (int)local_c8.ptr_ - (int)pRVar9;
      local_b8._12_4_ = uVar1;
      local_b8.length_ = iVar5;
      bVar15 = ParseState::PushRepeatOp(&local_98,op,&local_b8,bVar15);
      if (!bVar15) goto LAB_00125312;
      break;
    case 0x2e:
      ParseState::PushDot(&local_98);
      goto LAB_0012500a;
    }
  }
  else {
    if (0x5d < bVar12) {
      if (bVar12 != 0x5e) {
        if (bVar12 != 0x7b) {
          if (bVar12 != 0x7c) goto switchD_00124cb3_caseD_25;
          ParseState::DoVerticalBar(&local_98);
          goto LAB_0012500a;
        }
        local_68.ptr_ = local_c8.ptr_;
        local_68.length_ = local_c8.length_;
        local_68._12_4_ = local_c8._12_4_;
        local_b8.ptr_ = local_c8.ptr_;
        local_b8.length_ = local_c8.length_;
        local_b8._12_4_ = local_c8._12_4_;
        uVar2 = local_b8._8_8_;
        local_b8.length_ = local_c8.length_;
        if ((local_b8.length_ != 0) && (*(uint8 *)local_c8.ptr_ == '{')) {
          local_b8.ptr_ = (char *)((long)local_c8.ptr_ + 1);
          local_b8._12_4_ = uVar1;
          local_b8.length_ = local_b8.length_ + -1;
          bVar15 = ParseInteger(&local_b8,&local_a4);
          uVar2 = local_b8._8_8_;
          if ((bVar15) && (local_b8.length_ != 0)) {
            uVar13 = *(uint8 *)local_b8.ptr_;
            iVar10 = local_b8.length_;
            iVar3 = local_a4;
            if (uVar13 == ',') {
              local_b8.ptr_ = (char *)((long)local_b8.ptr_ + 1);
              iVar10 = local_b8.length_ + -1;
              local_b8.length_ = iVar10;
              uVar2 = local_b8._8_8_;
              if (iVar10 == 0) goto LAB_00125221;
              if (*local_b8.ptr_ == '}') {
                uVar13 = '}';
                iVar3 = -1;
              }
              else {
                bVar15 = ParseInteger(&local_b8,&local_a8);
                uVar2 = local_b8._8_8_;
                if (local_b8.length_ == 0 || !bVar15) goto LAB_00125221;
                uVar13 = *(uint8 *)local_b8.ptr_;
                iVar10 = local_b8.length_;
                iVar3 = local_a8;
              }
            }
            local_a8 = iVar3;
            pRVar9 = (Regexp *)local_68.ptr_;
            uVar2 = local_b8._8_8_;
            if (uVar13 == '}') {
              local_c8.ptr_ = (char *)((long)local_b8.ptr_ + 1);
              local_c8.length_ = iVar10 + -1;
              if ((local_98.flags_ & PerlX) == NoParseFlags) {
                iVar10 = (int)local_c8.ptr_;
                bVar15 = false;
              }
              else {
                if ((iVar10 + -1 < 1) || (*local_c8.ptr_ != '?')) {
                  bVar15 = false;
                }
                else {
                  local_c8.ptr_ = (char *)((long)local_b8.ptr_ + 2);
                  local_c8.length_ = iVar10 + -2;
                  bVar15 = true;
                }
                iVar10 = (int)local_c8.ptr_;
                if (0 < iVar5) {
                  pRVar11->code_ = kRegexpRepeatOp;
                  pRVar11 = &local_50;
                  if (local_a0 != (RegexpStatus *)0x0) {
                    pRVar11 = local_a0;
                  }
                  (pRVar11->error_arg_).ptr_ = (char *)pRVar7;
                  (pRVar11->error_arg_).length_ = iVar10 - (int)pRVar7;
                  goto LAB_00125312;
                }
              }
              iVar5 = iVar10 - (int)local_68.ptr_;
              local_68.length_ = iVar5;
              bVar15 = ParseState::PushRepetition(&local_98,local_a4,local_a8,&local_68,bVar15);
              if (bVar15) goto LAB_0012523e;
              goto LAB_00125312;
            }
          }
        }
LAB_00125221:
        local_b8._8_8_ = uVar2;
        ParseState::PushLiteral(&local_98,0x7b);
        local_c8.ptr_ = (char *)((long)local_c8.ptr_ + 1);
        local_c8.length_ = local_c8.length_ + -1;
        pRVar9 = (Regexp *)0x0;
        iVar5 = 0;
        goto LAB_0012523e;
      }
      ParseState::PushSimpleOp(&local_98,((local_98.flags_ & OneLine) >> 2) + kRegexpBeginLine);
LAB_0012500a:
      local_c8.ptr_ = (char *)((long)local_c8.ptr_ + 1);
      uVar6 = local_c8.length_ - 1;
LAB_00125014:
      local_c8.length_ = uVar6;
LAB_0012501a:
      pRVar9 = (Regexp *)0x0;
      iVar5 = 0;
      goto LAB_00125242;
    }
    if (bVar12 == 0x3f) {
      op = kRegexpQuest;
      goto LAB_00124e23;
    }
    if (bVar12 == 0x5b) {
      bVar15 = ParseState::ParseCharClass(&local_98,&local_c8,(Regexp **)&local_b8,pRVar11);
      if (bVar15) {
        ParseState::PushRegexp(&local_98,(Regexp *)local_b8.ptr_);
        goto LAB_00125148;
      }
      goto LAB_00125312;
    }
    if (bVar12 != 0x5c) goto switchD_00124cb3_caseD_25;
    if ((local_98.flags_ >> 8 & 1) == 0) {
LAB_00124cf4:
      if ((local_98.flags_ >> 9 & 1) == 0) {
        if (uVar6 != 1) {
          bVar12 = *(uint8 *)((long)local_c8.ptr_ + 1);
          goto LAB_00124d0a;
        }
        goto LAB_001250b7;
      }
      if (uVar6 == 1) goto LAB_001250b7;
      bVar12 = *(uint8 *)((long)local_c8.ptr_ + 1);
      if (0x50 < bVar12) {
        if (bVar12 != 0x51) {
          if (bVar12 != 0x7a) goto LAB_00124d0a;
          ParseState::PushSimpleOp(&local_98,kRegexpEndText);
          goto LAB_00124ff4;
        }
        local_c8.ptr_ = (char *)((long)local_c8.ptr_ + 2);
        local_c8.length_ = uVar6 - 2;
        iVar5 = uVar6 - 2;
        if (2 < uVar6) {
          while (((iVar5 == 1 || (*(uint8 *)local_c8.ptr_ != '\\')) ||
                 ((char)*(uint16 *)((long)local_c8.ptr_ + 1) != 'E'))) {
            iVar5 = StringPieceToRune((Rune *)&local_b8,&local_c8,pRVar11);
            if (iVar5 < 0) goto LAB_00125312;
            ParseState::PushLiteral(&local_98,(Rune)local_b8.ptr_);
            iVar5 = local_c8.length_;
            if (local_c8.length_ < 1) goto LAB_001252e3;
          }
          local_c8.ptr_ = (char *)((long)local_c8.ptr_ + 2);
          uVar6 = iVar5 - 2;
          local_c8.length_ = uVar6;
          goto LAB_0012501a;
        }
        goto LAB_001252e3;
      }
      if (bVar12 == 0x41) {
        ParseState::PushSimpleOp(&local_98,kRegexpBeginText);
LAB_00124ff4:
        local_c8.ptr_ = (char *)((long)local_c8.ptr_ + 2);
        uVar6 = local_c8.length_ - 2;
        goto LAB_00125014;
      }
      if (bVar12 == 0x43) {
        ParseState::PushSimpleOp(&local_98,kRegexpAnyByte);
        goto LAB_00124ff4;
      }
LAB_00124d0a:
      if ((bVar12 | 0x20) == 0x70) {
        pRVar7 = (Regexp *)operator_new(0x28);
        Regexp(pRVar7,kRegexpCharClass,parse_flags & ~FoldCase);
        pCVar8 = (CharClassBuilder *)operator_new(0x40);
        CharClassBuilder::CharClassBuilder(pCVar8);
        (pRVar7->field_7).field_3.ccb_ = pCVar8;
        PVar4 = ParseUnicodeGroup(&local_c8,parse_flags,pCVar8,pRVar11);
        if (PVar4 == kParseOk) {
          ParseState::PushRegexp(&local_98,pRVar7);
          goto LAB_00125148;
        }
        if (PVar4 == kParseNothing) {
          Decref(pRVar7);
          goto LAB_001250b7;
        }
        if (PVar4 == kParseError) {
          Decref(pRVar7);
          goto LAB_00125312;
        }
      }
    }
    else if (uVar6 != 1) {
      if ((*(uint8 *)((long)local_c8.ptr_ + 1) | 0x20) != 0x62) goto LAB_00124cf4;
      ParseState::PushSimpleOp
                (&local_98,*(uint8 *)((long)local_c8.ptr_ + 1) == 0x62 ^ kRegexpNoWordBoundary);
      goto LAB_00124ff4;
    }
LAB_001250b7:
    g = MaybeParsePerlCCEscape(&local_c8,parse_flags);
    if (g != (UGroup *)0x0) {
      pRVar7 = (Regexp *)operator_new(0x28);
      Regexp(pRVar7,kRegexpCharClass,parse_flags & ~FoldCase);
      pCVar8 = (CharClassBuilder *)operator_new(0x40);
      CharClassBuilder::CharClassBuilder(pCVar8);
      (pRVar7->field_7).field_3.ccb_ = pCVar8;
      AddUGroup(pCVar8,g,g->sign,parse_flags);
      ParseState::PushRegexp(&local_98,pRVar7);
      goto LAB_00125148;
    }
    bVar15 = ParseEscape(&local_c8,(Rune *)&local_b8,pRVar11,local_98.rune_max_);
    if (!bVar15) goto LAB_00125312;
    ParseState::PushLiteral(&local_98,(Rune)local_b8.ptr_);
LAB_00125148:
    pRVar9 = (Regexp *)0x0;
    iVar5 = 0;
  }
LAB_0012523e:
  uVar6 = local_c8.length_;
LAB_00125242:
  pRVar7 = pRVar9;
  if ((int)uVar6 < 1) goto LAB_001252e3;
  goto LAB_00124c8d;
LAB_00125312:
  pRVar9 = (Regexp *)0x0;
LAB_00125314:
  ParseState::~ParseState(&local_98);
  RegexpStatus::~RegexpStatus(&local_50);
  return pRVar9;
}

Assistant:

Regexp* Regexp::Parse(const StringPiece& s, ParseFlags global_flags,
                      RegexpStatus* status) {
  // Make status non-NULL (easier on everyone else).
  RegexpStatus xstatus;
  if (status == NULL)
    status = &xstatus;

  ParseState ps(global_flags, s, status);
  StringPiece t = s;

  // Convert regexp to UTF-8 (easier on the rest of the parser).
  if (global_flags & Latin1) {
    string* tmp = new string;
    ConvertLatin1ToUTF8(t, tmp);
    status->set_tmp(tmp);
    t = *tmp;
  }

  if (global_flags & Literal) {
    // Special parse loop for literal string.
    while (t.size() > 0) {
      Rune r;
      if (StringPieceToRune(&r, &t, status) < 0)
        return NULL;
      if (!ps.PushLiteral(r))
        return NULL;
    }
    return ps.DoFinish();
  }

  StringPiece lastunary = NULL;
  while (t.size() > 0) {
    StringPiece isunary = NULL;
    switch (t[0]) {
      default: {
        Rune r;
        if (StringPieceToRune(&r, &t, status) < 0)
          return NULL;
        if (!ps.PushLiteral(r))
          return NULL;
        break;
      }

      case '(':
        // "(?" introduces Perl escape.
        if ((ps.flags() & PerlX) && (t.size() >= 2 && t[1] == '?')) {
          // Flag changes and non-capturing groups.
          if (!ps.ParsePerlFlags(&t))
            return NULL;
          break;
        }
        if (ps.flags() & NeverCapture) {
          if (!ps.DoLeftParenNoCapture())
            return NULL;
        } else {
          if (!ps.DoLeftParen(NULL))
            return NULL;
        }
        t.remove_prefix(1);  // '('
        break;

      case '|':
        if (!ps.DoVerticalBar())
          return NULL;
        t.remove_prefix(1);  // '|'
        break;

      case ')':
        if (!ps.DoRightParen())
          return NULL;
        t.remove_prefix(1);  // ')'
        break;

      case '^':  // Beginning of line.
        if (!ps.PushCarat())
          return NULL;
        t.remove_prefix(1);  // '^'
        break;

      case '$':  // End of line.
        if (!ps.PushDollar())
          return NULL;
        t.remove_prefix(1);  // '$'
        break;

      case '.':  // Any character (possibly except newline).
        if (!ps.PushDot())
          return NULL;
        t.remove_prefix(1);  // '.'
        break;

      case '[': {  // Character class.
        Regexp* re;
        if (!ps.ParseCharClass(&t, &re, status))
          return NULL;
        if (!ps.PushRegexp(re))
          return NULL;
        break;
      }

      case '*': {  // Zero or more.
        RegexpOp op;
        op = kRegexpStar;
        goto Rep;
      case '+':  // One or more.
        op = kRegexpPlus;
        goto Rep;
      case '?':  // Zero or one.
        op = kRegexpQuest;
        goto Rep;
      Rep:
        StringPiece opstr = t;
        bool nongreedy = false;
        t.remove_prefix(1);  // '*' or '+' or '?'
        if (ps.flags() & PerlX) {
          if (t.size() > 0 && t[0] == '?') {
            nongreedy = true;
            t.remove_prefix(1);  // '?'
          }
          if (lastunary.size() > 0) {
            // In Perl it is not allowed to stack repetition operators:
            //   a** is a syntax error, not a double-star.
            // (and a++ means something else entirely, which we don't support!)
            status->set_code(kRegexpRepeatOp);
            status->set_error_arg(
                StringPiece(lastunary.begin(),
                            static_cast<int>(t.begin() - lastunary.begin())));
            return NULL;
          }
        }
        opstr.set(opstr.data(), static_cast<int>(t.data() - opstr.data()));
        if (!ps.PushRepeatOp(op, opstr, nongreedy))
          return NULL;
        isunary = opstr;
        break;
      }

      case '{': {  // Counted repetition.
        int lo, hi;
        StringPiece opstr = t;
        if (!MaybeParseRepetition(&t, &lo, &hi)) {
          // Treat like a literal.
          if (!ps.PushLiteral('{'))
            return NULL;
          t.remove_prefix(1);  // '{'
          break;
        }
        bool nongreedy = false;
        if (ps.flags() & PerlX) {
          if (t.size() > 0 && t[0] == '?') {
            nongreedy = true;
            t.remove_prefix(1);  // '?'
          }
          if (lastunary.size() > 0) {
            // Not allowed to stack repetition operators.
            status->set_code(kRegexpRepeatOp);
            status->set_error_arg(
                StringPiece(lastunary.begin(),
                            static_cast<int>(t.begin() - lastunary.begin())));
            return NULL;
          }
        }
        opstr.set(opstr.data(), static_cast<int>(t.data() - opstr.data()));
        if (!ps.PushRepetition(lo, hi, opstr, nongreedy))
          return NULL;
        isunary = opstr;
        break;
      }

      case '\\': {  // Escaped character or Perl sequence.
        // \b and \B: word boundary or not
        if ((ps.flags() & Regexp::PerlB) &&
            t.size() >= 2 && (t[1] == 'b' || t[1] == 'B')) {
          if (!ps.PushWordBoundary(t[1] == 'b'))
            return NULL;
          t.remove_prefix(2);  // '\\', 'b'
          break;
        }

        if ((ps.flags() & Regexp::PerlX) && t.size() >= 2) {
          if (t[1] == 'A') {
            if (!ps.PushSimpleOp(kRegexpBeginText))
              return NULL;
            t.remove_prefix(2);  // '\\', 'A'
            break;
          }
          if (t[1] == 'z') {
            if (!ps.PushSimpleOp(kRegexpEndText))
              return NULL;
            t.remove_prefix(2);  // '\\', 'z'
            break;
          }
          // Do not recognize \Z, because this library can't
          // implement the exact Perl/PCRE semantics.
          // (This library treats "(?-m)$" as \z, even though
          // in Perl and PCRE it is equivalent to \Z.)

          if (t[1] == 'C') {  // \C: any byte [sic]
            if (!ps.PushSimpleOp(kRegexpAnyByte))
              return NULL;
            t.remove_prefix(2);  // '\\', 'C'
            break;
          }

          if (t[1] == 'Q') {  // \Q ... \E: the ... is always literals
            t.remove_prefix(2);  // '\\', 'Q'
            while (t.size() > 0) {
              if (t.size() >= 2 && t[0] == '\\' && t[1] == 'E') {
                t.remove_prefix(2);  // '\\', 'E'
                break;
              }
              Rune r;
              if (StringPieceToRune(&r, &t, status) < 0)
                return NULL;
              if (!ps.PushLiteral(r))
                return NULL;
            }
            break;
          }
        }

        if (t.size() >= 2 && (t[1] == 'p' || t[1] == 'P')) {
          Regexp* re = new Regexp(kRegexpCharClass, ps.flags() & ~FoldCase);
          re->ccb_ = new CharClassBuilder;
          switch (ParseUnicodeGroup(&t, ps.flags(), re->ccb_, status)) {
            case kParseOk:
              if (!ps.PushRegexp(re))
                return NULL;
              goto Break2;
            case kParseError:
              re->Decref();
              return NULL;
            case kParseNothing:
              re->Decref();
              break;
          }
        }

        const UGroup *g = MaybeParsePerlCCEscape(&t, ps.flags());
        if (g != NULL) {
          Regexp* re = new Regexp(kRegexpCharClass, ps.flags() & ~FoldCase);
          re->ccb_ = new CharClassBuilder;
          AddUGroup(re->ccb_, g, g->sign, ps.flags());
          if (!ps.PushRegexp(re))
            return NULL;
          break;
        }

        Rune r;
        if (!ParseEscape(&t, &r, status, ps.rune_max()))
          return NULL;
        if (!ps.PushLiteral(r))
          return NULL;
        break;
      }
    }
  Break2:
    lastunary = isunary;
  }
  return ps.DoFinish();
}